

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O0

int RenderTest_RadianceMatches_Test::AddToRegistry(void)

{
  ParameterizedTestCaseInfo<RenderTest> *this;
  TestMetaFactoryBase<TestIntegrator> *in_stack_00000008;
  char *in_stack_00000010;
  undefined4 in_stack_00000018;
  int in_stack_0000001c;
  ParameterizedTestCaseInfo<RenderTest> *in_stack_00000020;
  char *in_stack_00000028;
  ParameterizedTestCaseRegistry *in_stack_00000030;
  
  testing::UnitTest::GetInstance();
  testing::UnitTest::parameterized_test_registry((UnitTest *)0x57ebc1);
  this = testing::internal::ParameterizedTestCaseRegistry::GetTestCasePatternHolder<RenderTest>
                   (in_stack_00000030,in_stack_00000028,(char *)in_stack_00000020,in_stack_0000001c)
  ;
  operator_new(8);
  testing::internal::TestMetaFactory<RenderTest_RadianceMatches_Test>::TestMetaFactory
            ((TestMetaFactory<RenderTest_RadianceMatches_Test> *)this);
  testing::internal::ParameterizedTestCaseInfo<RenderTest>::AddTestPattern
            (in_stack_00000020,(char *)CONCAT44(in_stack_0000001c,in_stack_00000018),
             in_stack_00000010,in_stack_00000008);
  return 0;
}

Assistant:

TEST_P(RenderTest, RadianceMatches) {
    const TestIntegrator &tr = GetParam();
    tr.integrator->Render();
    CheckSceneAverage(inTestDir("test.exr"), tr.scene.expected);
    // The SpatialLightSampler class keeps a per-thread cache that
    // must be cleared out between test runs. In turn, this means that we
    // must delete the Integrator here in order to make sure that its
    // destructor runs. (This is ugly and should be fixed in a better way.)
    delete tr.integrator;

    EXPECT_EQ(0, remove(inTestDir("test.exr").c_str()));
}